

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)

{
  uint nByte;
  unqlite *pDb;
  int iVar1;
  unqlite_kv_engine *pChunk;
  unqlite_kv_io *pChunk_00;
  ulong uVar2;
  unqlite_kv_engine *puVar3;
  unqlite_kv_engine *puVar4;
  unqlite_kv_engine *puVar5;
  
  pDb = pPager->pDb;
  if (pPager->pEngine == (unqlite_kv_engine *)0x0) {
LAB_00115684:
    nByte = pMethods->szKv;
    pChunk = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb->sMem,nByte);
    if (pChunk != (unqlite_kv_engine *)0x0) {
      pChunk_00 = (unqlite_kv_io *)SyMemBackendAlloc(&pDb->sMem,0x88);
      if (pChunk_00 != (unqlite_kv_io *)0x0) {
        uVar2 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)&pChunk_00->pHandle + uVar2 + 4) = 0;
          uVar2 = uVar2 + 4;
        } while (uVar2 < 0x54);
        if ((ulong)nByte != 0) {
          puVar3 = (unqlite_kv_engine *)((long)&pChunk->pIo + (ulong)nByte);
          puVar4 = pChunk;
          do {
            *(undefined1 *)&puVar4->pIo = 0;
            puVar5 = (unqlite_kv_engine *)((long)&puVar4->pIo + 1);
            if (puVar3 <= puVar5) break;
            *(undefined1 *)&puVar5->pIo = 0;
            puVar5 = (unqlite_kv_engine *)((long)&puVar4->pIo + 2);
            if (puVar3 <= puVar5) break;
            *(undefined1 *)&puVar5->pIo = 0;
            puVar5 = (unqlite_kv_engine *)((long)&puVar4->pIo + 3);
            if (puVar3 <= puVar5) break;
            *(undefined1 *)&puVar5->pIo = 0;
            puVar4 = (unqlite_kv_engine *)((long)&puVar4->pIo + 4);
          } while (puVar4 < puVar3);
        }
        pChunk_00->pHandle = pPager;
        pChunk_00->pMethods = pMethods;
        pChunk_00->xGet = unqliteKvIoPageGet;
        pChunk_00->xLookup = unqliteKvIoPageLookup;
        pChunk_00->xNew = unqliteKvIoNewPage;
        pChunk_00->xWrite = unqliteKvIopageWrite;
        pChunk_00->xDontWrite = unqliteKvIoPageDontWrite;
        pChunk_00->xDontJournal = unqliteKvIoPageDontJournal;
        pChunk_00->xDontMkHot = unqliteKvIoPageDontMakeHot;
        pChunk_00->xPageRef = unqliteKvIopage_ref;
        pChunk_00->xPageUnref = unqliteKvIoPageUnRef;
        pChunk_00->xPageSize = unqliteKvIoPageSize;
        pChunk_00->xReadOnly = unqliteKvIoReadOnly;
        pChunk_00->xTmpPage = unqliteKvIoTempPage;
        pChunk_00->xSetUnpin = unqliteKvIoPageUnpin;
        pChunk_00->xSetReload = unqliteKvIoPageReload;
        pChunk_00->xErr = unqliteKvIoErr;
        pChunk->pIo = pChunk_00;
        if (pMethods->xInit != (_func_int_unqlite_kv_engine_ptr_int *)0x0) {
          iVar1 = 0x1000;
          if (0xffff01fe < sUnqlMPGlobal.iPageSize - 0x10001U) {
            iVar1 = sUnqlMPGlobal.iPageSize;
          }
          iVar1 = (*pMethods->xInit)(pChunk,iVar1);
          if (iVar1 != 0) {
            unqliteGenErrorFormat
                      (pDb,"xInit() method of the underlying KV engine \'%z\' failed",&pPager->sKv);
            goto LAB_00115856;
          }
          pChunk->pIo = pChunk_00;
        }
        pPager->pEngine = pChunk;
        iVar1 = unqliteInitCursor(pDb,&(pDb->sDB).pCursor);
        if (iVar1 != 0) {
LAB_00115856:
          SyMemBackendFree(&pDb->sMem,pChunk);
          SyMemBackendFree(&pDb->sMem,pChunk_00);
          return iVar1;
        }
        goto LAB_0011586e;
      }
      SyMemBackendFree(&pDb->sMem,pChunk);
    }
    unqliteGenError(pDb,"unQLite is running out of memory");
    iVar1 = -1;
  }
  else {
    if (pPager->pEngine->pIo->pMethods != pMethods) {
      pager_release_kv_engine(pPager);
      goto LAB_00115684;
    }
LAB_0011586e:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRegisterKvEngine(Pager *pPager,unqlite_kv_methods *pMethods)
{
	unqlite_db *pStorage = &pPager->pDb->sDB;
	unqlite *pDb = pPager->pDb;
	unqlite_kv_engine *pEngine;
	unqlite_kv_io *pIo;
	sxu32 nByte;
	int rc;
	if( pPager->pEngine ){
		if( pMethods == pPager->pEngine->pIo->pMethods ){
			/* Ticket 1432: Same implementation */
			return UNQLITE_OK;
		}
		/* Release the old KV engine */
		pager_release_kv_engine(pPager);
	}
	/* Allocate a new KV engine instance */
	nByte = (sxu32)pMethods->szKv;
	pEngine = (unqlite_kv_engine *)SyMemBackendAlloc(&pDb->sMem,nByte);
	if( pEngine == 0 ){
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	pIo = (unqlite_kv_io *)SyMemBackendAlloc(&pDb->sMem,sizeof(unqlite_kv_io));
	if( pIo == 0 ){
		SyMemBackendFree(&pDb->sMem,pEngine);
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pIo,sizeof(unqlite_io_methods));
	SyZero(pEngine,nByte);
	/* Populate the IO structure */
	pager_kv_io_init(pPager,pMethods,pIo);
	pEngine->pIo = pIo;
	/* Invoke the init callback if avaialble */
	if( pMethods->xInit ){
		rc = pMethods->xInit(pEngine,unqliteGetPageSize());
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,
				"xInit() method of the underlying KV engine '%z' failed",&pPager->sKv);
			goto fail;
		}
		pEngine->pIo = pIo;
	}
	pPager->pEngine = pEngine;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pStorage->pCursor);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	return UNQLITE_OK;
fail:
	SyMemBackendFree(&pDb->sMem,pEngine);
	SyMemBackendFree(&pDb->sMem,pIo);
	return rc;
}